

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void pstore::create_log_stream(string *ident)

{
  pointer *ppuVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  *this;
  _Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  _Var5;
  pointer *__ptr;
  _Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_> _Var6;
  size_type __n;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar7;
  pointer puVar8;
  pointer *__ptr_1;
  pointer puVar9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *__cur;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *puVar10;
  long *in_FS_OFFSET;
  __single_object loggers;
  _Head_base<0UL,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_*,_false>
  local_38;
  
  local_38._M_head_impl =
       (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
        *)operator_new(0x18);
  *(undefined8 *)local_38._M_head_impl = 0;
  *(pointer *)((long)local_38._M_head_impl + 8) = (pointer)0x0;
  *(pointer *)((long)local_38._M_head_impl + 0x10) = (pointer)0x0;
  std::
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  ::reserve(local_38._M_head_impl,1);
  _Var5._M_head_impl = local_38._M_head_impl;
  _Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl =
       (_Head_base<0UL,_pstore::logger_*,_false>)operator_new(0x68);
  ((string *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 8))->
  _M_dataplus = (pointer)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl +
                         0x18);
  ((string *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x10))->
  _M_dataplus = (pointer)0x0;
  *(char *)&((string *)
            ((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x18))->
            _M_dataplus = '\0';
  *(undefined8 *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x28) =
       0x800000007;
  *(undefined ***)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl =
       &PTR__logger_0019ac50;
  ((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
  _vptr_logger = (_func_int **)0x0;
  (((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
  buffer_)._M_dataplus._M_p = (pointer)0x0;
  (((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
  buffer_)._M_string_length = 0;
  (((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
  buffer_).field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&(((logger *)
            ((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
           buffer_).field_2 + 8) = 0;
  *(undefined8 *)
   &((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30))->
    priority_ = 0;
  *(undefined2 *)
   &((logger *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x60))->
    _vptr_logger = 0;
  strncpy((char *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30U),
          (ident->_M_dataplus)._M_p,0x31);
  *(undefined1 *)
   ((long)&((logger *)
           ((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x60))->
           _vptr_logger + 1) = 0;
  openlog((char *)((long)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl + 0x30U),
          1,8);
  puVar9 = ((_Var5._M_head_impl)->
           super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 == ((_Var5._M_head_impl)->
                super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = std::
          vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
          ::_M_check_len(_Var5._M_head_impl,1,"vector::_M_realloc_insert");
    puVar2 = ((_Var5._M_head_impl)->
             super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar3 = ((_Var5._M_head_impl)->
             super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__n == 0) {
      puVar7 = (unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *)0x0;
    }
    else {
      puVar7 = __gnu_cxx::
               new_allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>
               ::allocate((new_allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>
                           *)_Var5._M_head_impl,__n,(void *)0x0);
    }
    puVar7[(long)puVar9 - (long)puVar2 >> 3]._M_t.
    super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>._M_t.
    super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
    super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl =
         (logger *)_Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl;
    puVar10 = puVar7;
    for (puVar8 = puVar2; puVar8 != puVar9; puVar8 = puVar8 + 1) {
      (puVar10->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl =
           ((logger *)
           (puVar8->_M_t).
           super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>._M_t.
           super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
           super__Head_base<0UL,_pstore::logger_*,_false>)._M_head_impl;
      (puVar8->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false> = (_Head_base<0UL,_pstore::logger_*,_false>)0x0
      ;
      puVar10 = puVar10 + 1;
    }
    for (; puVar10 = puVar10 + 1, puVar3 != puVar9; puVar9 = puVar9 + 1) {
      (puVar10->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl =
           ((logger *)
           (puVar9->_M_t).
           super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>._M_t.
           super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
           super__Head_base<0UL,_pstore::logger_*,_false>)._M_head_impl;
      (puVar9->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>.
      _M_t.super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
      super__Head_base<0UL,_pstore::logger_*,_false> = (_Head_base<0UL,_pstore::logger_*,_false>)0x0
      ;
    }
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)((_Var5._M_head_impl)->
                                   super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)puVar2);
    }
    ((_Var5._M_head_impl)->
    super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = puVar7;
    ((_Var5._M_head_impl)->
    super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = puVar10;
    ((_Var5._M_head_impl)->
    super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7 + __n;
  }
  else {
    (puVar9->_M_t).super___uniq_ptr_impl<pstore::logger,_std::default_delete<pstore::logger>_>._M_t.
    super__Tuple_impl<0UL,_pstore::logger_*,_std::default_delete<pstore::logger>_>.
    super__Head_base<0UL,_pstore::logger_*,_false> =
         _Var6.super__Head_base<0UL,_pstore::logger_*,_false>._M_head_impl;
    ppuVar1 = &((_Var5._M_head_impl)->
               super__Vector_base<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  lVar4 = *in_FS_OFFSET;
  this = *(vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
           **)(lVar4 + -8);
  if (this != (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
               *)0x0) {
    std::
    vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    ::~vector(this);
    operator_delete(this,0x18);
  }
  _Var5._M_head_impl = local_38._M_head_impl;
  local_38._M_head_impl =
       (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
        *)0x0;
  *(vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
    **)(lVar4 + -8) = _Var5._M_head_impl;
  std::
  unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>_>
                 *)&local_38);
  return;
}

Assistant:

void create_log_stream (std::string const & ident) {
            std::bitset<handlers::last> enabled;

#ifdef PSTORE_HAVE_OSLOG_H
            enabled.set (handlers::asl);
#elif defined(PSTORE_HAVE_SYS_LOG_H)
            enabled.set (handlers::syslog);
#else
            // TODO: At the moment, I just log to stderr unless syslog() or ASL are available.
            // Consider offering an option to the user to control the logging destination and
            // whether to use file-base logging.
            enabled.set (handlers::standard_error);
#endif

            auto loggers = std::make_unique<details::logger_collection> ();
            loggers->reserve (enabled.count ());

#ifdef PSTORE_HAVE_OSLOG_H
            if (enabled.test (handlers::asl)) {
                loggers->emplace_back (new asl_logger (ident));
            }
#endif
#ifdef PSTORE_HAVE_SYS_LOG_H
            if (enabled.test (handlers::syslog)) {
                // NOLINTNEXTLINE(hicpp-signed-bitwise)
                loggers->emplace_back (new syslog_logger (ident, LOG_USER));
            }
#endif

            if (enabled.test (handlers::rotating_file)) {
                constexpr auto max_size = std::streamoff{1024 * 1024};
                constexpr auto num_backups = 10U;
                loggers->emplace_back (new rotating_log (ident + ".log", max_size, num_backups));
            }

            if (enabled.test (handlers::standard_error)) {
                loggers->emplace_back (new stderr_logger);
            }

            using details::log_destinations;
            delete log_destinations;
            log_destinations = loggers.release ();
        }